

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O3

int Pla_ManDist1Num(Pla_Man_t *p)

{
  long lVar1;
  uint uVar2;
  word *pwVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  uVar6 = (ulong)(p->vCubes).nSize;
  if ((long)uVar6 < 1) {
    iVar5 = 0;
  }
  else {
    uVar2 = p->nInWords;
    lVar7 = (long)(int)uVar2;
    lVar1 = lVar7 * 8;
    lVar14 = 0;
    uVar9 = 1;
    uVar16 = 0;
    iVar5 = 0;
    lVar8 = lVar1;
    do {
      if (((long)(uVar16 * lVar7) < 0) ||
         (lVar18 = (long)(p->vInBits).nSize, lVar18 <= (long)(uVar16 * lVar7))) {
LAB_0036ffd5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar16 = uVar16 + 1;
      if (uVar16 < uVar6) {
        pwVar3 = (p->vInBits).pArray;
        lVar15 = (long)pwVar3 + lVar8;
        uVar10 = uVar9;
        do {
          if (((long)(uVar10 * lVar7) < 0) || (lVar18 <= (long)(uVar10 * lVar7))) goto LAB_0036ffd5;
          if ((int)uVar2 < 1) {
            iVar11 = 0;
          }
          else {
            uVar17 = 0;
            iVar12 = 0;
            do {
              uVar4 = *(ulong *)((long)pwVar3 + uVar17 * 8 + lVar14);
              uVar13 = *(ulong *)(lVar15 + uVar17 * 8);
              if ((uVar4 != uVar13) &&
                 ((iVar11 = 0, iVar12 != 0 ||
                  (uVar13 = uVar13 ^ uVar4, uVar13 = (uVar13 >> 1 | uVar13) & 0x5555555555555555,
                  uVar4 = uVar13 - 1, iVar12 = 1, (uVar13 ^ uVar4) <= uVar4)))) break;
              iVar11 = iVar12;
              uVar17 = uVar17 + 1;
              iVar12 = iVar11;
            } while (uVar2 != uVar17);
          }
          iVar5 = iVar5 + iVar11;
          uVar10 = uVar10 + 1;
          lVar15 = lVar15 + lVar1;
        } while (uVar10 != uVar6);
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + lVar1;
      lVar14 = lVar14 + lVar1;
    } while (uVar16 != uVar6);
  }
  return iVar5;
}

Assistant:

int Pla_ManDist1Num( Pla_Man_t * p )
{
    word * pCube1, * pCube2; 
    int i, k, Dist, Count = 0;
    Pla_ForEachCubeIn( p, pCube1, i )
    Pla_ForEachCubeInStart( p, pCube2, k, i+1 )
    {
        Dist = Pla_CubesAreDistance1( pCube1, pCube2, p->nInWords );
//        Dist = Pla_CubesAreConsensus( pCube1, pCube2, p->nInWords, NULL );
        Count += (Dist == 1);
    }
    return Count;
}